

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cc
# Opt level: O0

void __thiscall
RegisterLexerReadEvalStringEscapes::RegisterLexerReadEvalStringEscapes
          (RegisterLexerReadEvalStringEscapes *this)

{
  RegisterLexerReadEvalStringEscapes *this_local;
  
  RegisterTest(LexerReadEvalStringEscapes::Create,"Lexer.ReadEvalStringEscapes");
  return;
}

Assistant:

TEST(Lexer, ReadEvalStringEscapes) {
  Lexer lexer("$ $$ab c$: $\ncde\n");
  EvalString eval;
  string err;
  EXPECT_TRUE(lexer.ReadVarValue(&eval, &err));
  EXPECT_EQ("", err);
  EXPECT_EQ("[ $ab c: cde]",
            eval.Serialize());
}